

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::Own<const_kj::ReadableDirectory>_> __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenSubdir(DiskHandle *this,PathPtr path)

{
  size_t in_RCX;
  ReadableDirectory *extraout_RDX;
  Maybe<kj::Own<const_kj::ReadableDirectory>_> MVar1;
  PathPtr path_00;
  NullableValue<kj::AutoCloseFd> local_34;
  Own<kj::ReadableDirectory> local_28;
  
  path_00.parts.ptr = (String *)path.parts.size_;
  path_00.parts.size_ = in_RCX;
  tryOpenSubdirInternal((Maybe<kj::AutoCloseFd> *)&local_34,(DiskHandle *)path.parts.ptr,path_00);
  Maybe<kj::AutoCloseFd>::map<kj::Own<kj::ReadableDirectory>_(&)(kj::AutoCloseFd)>
            ((Maybe<kj::AutoCloseFd> *)&local_28,
             (_func_Own<kj::ReadableDirectory>_AutoCloseFd *)&local_34);
  this->fd = (AutoCloseFd)local_28.disposer;
  this[1].fd = (AutoCloseFd)local_28.ptr;
  local_28.ptr = (ReadableDirectory *)0x0;
  Own<kj::ReadableDirectory>::dispose(&local_28);
  kj::_::NullableValue<kj::AutoCloseFd>::~NullableValue(&local_34);
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const {
    return tryOpenSubdirInternal(path).map(newDiskReadableDirectory);
  }